

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall
wasm::TranslateToFuzzReader::addInvocations(TranslateToFuzzReader *this,Function *func)

{
  pointer *pppEVar1;
  pointer *pppEVar2;
  TranslateToFuzzReader *pTVar3;
  Random *this_00;
  size_t sVar4;
  unique_ptr *puVar5;
  uint32_t uVar6;
  long *plVar7;
  char *pcVar8;
  long lVar9;
  Expression *pEVar10;
  Expression *pEVar11;
  uintptr_t *puVar12;
  Expression *pEVar13;
  uintptr_t extraout_RDX;
  ulong extraout_RDX_00;
  pointer ppEVar14;
  MixedArena *pMVar15;
  Name NVar16;
  Name NVar17;
  Name name;
  undefined1 auVar18 [16];
  HeapType local_160;
  undefined1 auStack_158 [8];
  FunctionCreationContext context;
  Expression local_a8;
  TranslateToFuzzReader *local_98;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_90;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> invoker;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> invocations;
  Expression *local_40;
  Expression *invoke;
  
  pcVar8 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
  pppEVar1 = &invocations.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  auStack_68 = (undefined1  [8])pppEVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_68,pcVar8,
             pcVar8 + (func->super_Importable).super_Named.name.super_IString.str._M_len);
  pppEVar2 = &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)pppEVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&invoker,"_invoker","");
  ppEVar14 = (pointer)0xf;
  if (auStack_68 != (undefined1  [8])pppEVar1) {
    ppEVar14 = invocations.
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
  }
  if (ppEVar14 <
      (pointer)((long)args.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start +
               (long)invocations.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start)) {
    ppEVar14 = (pointer)0xf;
    if (invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
        _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
        (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)pppEVar2)
    {
      ppEVar14 = args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    if ((pointer)((long)args.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                 (long)invocations.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_start) <= ppEVar14) {
      plVar7 = (long *)std::__cxx11::string::replace
                                 ((ulong)&invoker,0,(char *)0x0,(ulong)auStack_68);
      goto LAB_001208e1;
    }
  }
  plVar7 = (long *)std::__cxx11::string::_M_append
                             (auStack_68,
                              (ulong)invoker._M_t.
                                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                     .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
LAB_001208e1:
  auStack_158 = (undefined1  [8])&context.func;
  pTVar3 = (TranslateToFuzzReader *)(plVar7 + 2);
  if ((TranslateToFuzzReader *)*plVar7 == pTVar3) {
    context.func = (Function *)pTVar3->wasm;
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = (undefined4)plVar7[3];
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
  }
  else {
    context.func = (Function *)pTVar3->wasm;
    auStack_158 = (undefined1  [8])*plVar7;
  }
  context.parent = (TranslateToFuzzReader *)plVar7[1];
  *plVar7 = (long)pTVar3;
  plVar7[1] = 0;
  *(undefined1 *)&pTVar3->wasm = 0;
  auVar18 = wasm::IString::interned(context.parent,auStack_158,0);
  pcVar8 = auVar18._0_8_;
  if (auStack_158 != (undefined1  [8])&context.func) {
    operator_delete((void *)auStack_158,
                    (ulong)((long)&((context.func)->super_Importable).super_Named.name.super_IString
                                   .str._M_len + 1));
  }
  if (invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
      (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)pppEVar2) {
    operator_delete((void *)invoker._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                    (long)args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  if (auStack_68 != (undefined1  [8])pppEVar1) {
    operator_delete((void *)auStack_68,
                    (long)invocations.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  NVar16.super_IString.str._M_str = pcVar8;
  NVar16.super_IString.str._M_len = (size_t)this->wasm;
  lVar9 = wasm::Module::getFunctionOrNull(NVar16);
  if ((lVar9 == 0) &&
     (NVar17.super_IString.str._M_str = pcVar8, NVar17.super_IString.str._M_len = (size_t)this->wasm
     , lVar9 = wasm::Module::getExportOrNull(NVar17), lVar9 == 0)) {
    wasm::HeapType::HeapType(&local_160,(Signature)ZEXT816(0));
    auStack_158 = (undefined1  [8])0x0;
    context.parent = (TranslateToFuzzReader *)0x0;
    context.func = (Function *)0x0;
    name.super_IString.str._M_str = pcVar8;
    name.super_IString.str._M_len = (size_t)&local_90;
    Builder::makeFunction
              (name,(HeapType)auVar18._8_8_,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_160.id,
               (Expression *)auStack_158);
    if (auStack_158 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_158,(long)context.func - (long)auStack_158);
    }
    pMVar15 = (MixedArena *)((this->builder).wasm + 0x158);
    pEVar10 = (Expression *)MixedArena::allocSpace(pMVar15,0x40,8);
    pEVar10->_id = BlockId;
    (pEVar10->type).id = 0;
    *(undefined8 *)(pEVar10 + 1) = 0;
    pEVar10[1].type.id = 0;
    *(undefined8 *)(pEVar10 + 2) = 0;
    pEVar10[2].type.id = 0;
    *(undefined8 *)(pEVar10 + 3) = 0;
    pEVar10[3].type.id = (uintptr_t)pMVar15;
    *(Expression **)
     ((long)local_90._M_t.
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x60) = pEVar10;
    context.hangStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)&context.typeLocals._M_h._M_rehash_policy._M_next_resize;
    context.parent =
         (TranslateToFuzzReader *)
         local_90._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    context.labelIndex = 0;
    context._44_4_ = 0;
    context.hangStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    context.hangStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    context.func = (Function *)0x0;
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = 0;
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    context.breakableStack.
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._12_8_ = 0;
    context.typeLocals._M_h._M_buckets = (__buckets_ptr)0x1;
    context.typeLocals._M_h._M_bucket_count = 0;
    context.typeLocals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    context.typeLocals._M_h._M_element_count._0_4_ = 0x3f800000;
    context.typeLocals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    context.typeLocals._M_h._M_rehash_policy._4_4_ = 0;
    context.typeLocals._M_h._M_rehash_policy._M_next_resize = 0;
    this->funcContext = (FunctionCreationContext *)auStack_158;
    invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_68 = (undefined1  [8])0x0;
    invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    this_00 = &this->random;
    local_a8.type.id = (uintptr_t)&func->type;
    auStack_158 = (undefined1  [8])this;
    local_98 = this;
    while( true ) {
      uVar6 = Random::upTo(this_00,2);
      if ((uVar6 != 0) || ((this->random).finishedInput != false)) break;
      invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8._0_8_ = wasm::HeapType::getSignature();
      invoke = (Expression *)0x0;
      local_40 = &local_a8;
      pEVar11 = (Expression *)wasm::Type::size();
      if (invoke == pEVar11) goto LAB_00120ba2;
      do {
        do {
          puVar12 = (uintptr_t *)
                    wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffc0);
          context.typeLocals._M_h._M_single_bucket = (__node_base_ptr)makeConst(this,(Type)*puVar12)
          ;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&invoker,
                     (Expression **)&context.typeLocals._M_h._M_single_bucket);
          invoke = (Expression *)((long)&invoke->_id + 1);
        } while (invoke != pEVar11);
LAB_00120ba2:
      } while (local_40 != &local_a8);
      sVar4 = (func->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar8 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
      wasm::HeapType::getSignature();
      pMVar15 = (MixedArena *)((local_98->builder).wasm + 0x158);
      pEVar11 = (Expression *)MixedArena::allocSpace(pMVar15,0x48,8);
      pEVar11->_id = CallId;
      *(undefined8 *)(pEVar11 + 1) = 0;
      pEVar11[1].type.id = 0;
      *(undefined8 *)(pEVar11 + 2) = 0;
      pEVar11[2].type.id = (uintptr_t)pMVar15;
      *(undefined1 *)&pEVar11[4]._id = InvalidId;
      (pEVar11->type).id = extraout_RDX;
      *(size_t *)(pEVar11 + 3) = sVar4;
      pEVar11[3].type.id = (uintptr_t)pcVar8;
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar11 + 1),
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&invoker);
      *(undefined1 *)&pEVar11[4]._id = InvalidId;
      local_40 = pEVar11;
      wasm::HeapType::getSignature();
      pEVar11 = local_40;
      if (1 < extraout_RDX_00) {
        pEVar13 = (Expression *)
                  MixedArena::allocSpace((MixedArena *)((local_98->builder).wasm + 0x158),0x18,8);
        pEVar13->_id = DropId;
        (pEVar13->type).id = 0;
        *(Expression **)(pEVar13 + 1) = pEVar11;
        wasm::Drop::finalize();
        local_40 = pEVar13;
      }
      if (invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                   (iterator)
                   invocations.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,&stack0xffffffffffffffc0);
      }
      else {
        *invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_start = local_40;
        invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      uVar6 = Random::upTo(this_00,2);
      this = local_98;
      if (uVar6 == 0) {
        local_a8._0_8_ = makeMemoryHashLogging(local_98);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                   (Expression **)&local_a8);
      }
      if ((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
          invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0) {
        operator_delete((void *)invoker._M_t.
                                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                        (long)args.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)invoker._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
    }
    if (auStack_68 !=
        (undefined1  [8])
        invocations.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar10 + 2),
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_68);
      wasm::Module::addFunction((unique_ptr *)this->wasm);
      puVar5 = (unique_ptr *)this->wasm;
      invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           operator_new(0x28);
      *(undefined8 *)
       *(undefined1 (*) [16])
        ((long)invoker._M_t.
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) = 0;
      *(undefined1 (*) [16])
       invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
       .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
       super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = auVar18;
      *(undefined1 (*) [16])
       ((long)invoker._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x10) = auVar18;
      wasm::Module::addExport(puVar5);
      if ((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
          invoker._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0) {
        operator_delete((void *)invoker._M_t.
                                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,0x28);
      }
    }
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)invocations.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
    }
    FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)auStack_158);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_90);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addInvocations(Function* func) {
  Name name = func->name.toString() + std::string("_invoker");
  if (wasm.getFunctionOrNull(name) || wasm.getExportOrNull(name)) {
    return;
  }
  auto invoker = builder.makeFunction(name, Signature(), {});
  Block* body = builder.makeBlock();
  invoker->body = body;
  FunctionCreationContext context(*this, invoker.get());
  std::vector<Expression*> invocations;
  while (oneIn(2) && !random.finished()) {
    std::vector<Expression*> args;
    for (const auto& type : func->getParams()) {
      args.push_back(makeConst(type));
    }
    Expression* invoke = builder.makeCall(func->name, args, func->getResults());
    if (func->getResults().isConcrete()) {
      invoke = builder.makeDrop(invoke);
    }
    invocations.push_back(invoke);
    // log out memory in some cases
    if (oneIn(2)) {
      invocations.push_back(makeMemoryHashLogging());
    }
  }
  if (invocations.empty()) {
    return;
  }
  body->list.set(invocations);
  wasm.addFunction(std::move(invoker));
  wasm.addExport(builder.makeExport(name, name, ExternalKind::Function));
}